

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::RandomGroup::init(RandomGroup *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  bool bVar1;
  int i;
  uint uVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  CompatibilityTestType CVar8;
  int extraout_EAX;
  long lVar9;
  iterator iVar10;
  DrawTest *this_00;
  ulong uVar11;
  int attrNdx;
  int iVar12;
  deUint32 hash;
  AttributeSpec attribSpec;
  size_t insertedCount;
  DrawMethod drawMethods [2];
  DrawTestSpec spec;
  IndexType indexTypes [3];
  IndexType local_3a4;
  int indirectOffsets [3];
  int local_394;
  int firsts [3];
  int local_384;
  int indexOffsets [3];
  int local_374;
  int primitiveCounts [3];
  int local_364;
  int attribCounts [3];
  int local_354;
  char *local_350;
  ulong local_348;
  float local_340 [2];
  float indirectOffsetWeigths [3];
  float firstWeights [3];
  float indexOffsetWeights [3];
  float primitiveCountWeights [3];
  float attribWeights [3];
  int baseVertices [5];
  int local_2d4 [3];
  int instanceDivisors [4];
  int strides [4];
  int offsets [4];
  float indexWeights [4];
  int indexMaxs [4];
  int indexMins [4];
  int instanceCounts [4];
  int local_258;
  UniformWeightArray<3> indexTypeWeights;
  float baseVertexWeigths [5];
  Primitive primitives [7];
  Primitive local_20c;
  Usage usages [9];
  Usage local_1e4 [3];
  float instanceDivisorWeights [4];
  float strideWeights [4];
  float offsetWeights [4];
  float instanceWeights [4];
  string local_198;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> insertedHashes;
  InputType inputTypes [11];
  InputType local_11c;
  OutputType outputTypes [12];
  OutputType local_e8 [3];
  UniformWeightArray<7> primitiveWeights;
  Random random;
  UniformWeightArray<9> usageWeights;
  UniformWeightArray<11> inputTypeWeights;
  UniformWeightArray<12> outputTypeWeights;
  
  attribCounts[0] = 1;
  attribCounts[1] = 2;
  attribCounts[2] = 5;
  attribWeights[2] = 1.0;
  attribWeights[0] = 30.0;
  attribWeights[1] = 10.0;
  primitiveCounts[0] = 1;
  primitiveCounts[1] = 5;
  primitiveCounts[2] = 0x40;
  primitiveCountWeights[2] = 1.0;
  primitiveCountWeights[0] = 20.0;
  primitiveCountWeights[1] = 10.0;
  firsts[2] = 0xd;
  indexOffsets[0] = 0;
  indexOffsets[1] = 7;
  indexOffsetWeights[2] = 1.0;
  indexOffsetWeights[0] = 20.0;
  indexOffsetWeights[1] = 20.0;
  firsts[0] = 0;
  firsts[1] = 7;
  firstWeights[2] = 1.0;
  firstWeights[0] = 20.0;
  firstWeights[1] = 20.0;
  instanceCounts[0] = 1;
  instanceCounts[1] = 2;
  instanceCounts[2] = 0x10;
  instanceCounts[3] = 0x11;
  instanceWeights[0] = 20.0;
  instanceWeights[1] = 10.0;
  instanceWeights[2] = 5.0;
  instanceWeights[3] = 1.0;
  indexMins[0] = 0;
  indexMins[1] = 1;
  indexMins[2] = 3;
  indexMins[3] = 8;
  indexMaxs[0] = 4;
  indexMaxs[1] = 8;
  indexMaxs[2] = 0x80;
  indexMaxs[3] = 0x101;
  indexWeights[0] = 50.0;
  indexWeights[1] = 50.0;
  indexWeights[2] = 50.0;
  indexWeights[3] = 50.0;
  offsets[0] = 0;
  offsets[1] = 1;
  offsets[2] = 5;
  offsets[3] = 0xc;
  offsetWeights[0] = 50.0;
  offsetWeights[1] = 10.0;
  offsetWeights[2] = 10.0;
  offsetWeights[3] = 10.0;
  strides[0] = 0;
  strides[1] = 7;
  strides[2] = 0x10;
  strides[3] = 0x11;
  strideWeights[0] = 50.0;
  strideWeights[1] = 10.0;
  strideWeights[2] = 10.0;
  strideWeights[3] = 10.0;
  instanceDivisors[0] = 0;
  instanceDivisors[1] = 1;
  instanceDivisors[2] = 3;
  instanceDivisors[3] = 0x81;
  instanceDivisorWeights[0] = 70.0;
  instanceDivisorWeights[1] = 30.0;
  instanceDivisorWeights[2] = 10.0;
  instanceDivisorWeights[3] = 10.0;
  indirectOffsets[0] = 0;
  indirectOffsets[1] = 1;
  indirectOffsets[2] = 2;
  indirectOffsetWeigths[2] = 1.0;
  indirectOffsetWeigths[0] = 2.0;
  indirectOffsetWeigths[1] = 1.0;
  baseVertices[0] = 0;
  baseVertices[1] = 1;
  baseVertices[2] = -2;
  baseVertices[3] = 4;
  baseVertices[4] = 3;
  baseVertexWeigths[4] = 1.0;
  baseVertexWeigths[0] = 4.0;
  baseVertexWeigths[1] = 1.0;
  baseVertexWeigths[2] = 1.0;
  baseVertexWeigths[3] = 1.0;
  primitives[4] = PRIMITIVE_LINES;
  primitives[5] = PRIMITIVE_LINE_STRIP;
  primitives[6] = PRIMITIVE_LINE_LOOP;
  primitives[0] = PRIMITIVE_POINTS;
  primitives[1] = PRIMITIVE_TRIANGLES;
  primitives[2] = PRIMITIVE_TRIANGLE_FAN;
  primitives[3] = PRIMITIVE_TRIANGLE_STRIP;
  for (lVar9 = 0; lVar9 != 7; lVar9 = lVar9 + 1) {
    primitiveWeights.weights[lVar9] = 1.0;
  }
  drawMethods[0] = DRAWMETHOD_DRAWARRAYS_INDIRECT;
  drawMethods[1] = DRAWMETHOD_DRAWELEMENTS_INDIRECT;
  local_340[0] = 1.0;
  local_340[1] = 1.0;
  indexTypes[0] = INDEXTYPE_BYTE;
  indexTypes[1] = INDEXTYPE_SHORT;
  indexTypes[2] = INDEXTYPE_INT;
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    indexTypeWeights.weights[lVar9] = 1.0;
  }
  inputTypes[8] = INPUTTYPE_HALF;
  inputTypes[9] = INPUTTYPE_UNSIGNED_INT_2_10_10_10;
  inputTypes[10] = INPUTTYPE_INT_2_10_10_10;
  inputTypes[4] = INPUTTYPE_UNSIGNED_BYTE;
  inputTypes[5] = INPUTTYPE_UNSIGNED_SHORT;
  inputTypes[6] = INPUTTYPE_INT;
  inputTypes[7] = INPUTTYPE_UNSIGNED_INT;
  inputTypes[0] = INPUTTYPE_FLOAT;
  inputTypes[1] = INPUTTYPE_FIXED;
  inputTypes[2] = INPUTTYPE_BYTE;
  inputTypes[3] = INPUTTYPE_SHORT;
  for (lVar9 = 0; lVar9 != 0xb; lVar9 = lVar9 + 1) {
    inputTypeWeights.weights[lVar9] = 1.0;
  }
  outputTypes[8] = OUTPUTTYPE_IVEC4;
  outputTypes[9] = OUTPUTTYPE_UVEC2;
  outputTypes[10] = OUTPUTTYPE_UVEC3;
  outputTypes[0xb] = OUTPUTTYPE_UVEC4;
  outputTypes[4] = OUTPUTTYPE_INT;
  outputTypes[5] = OUTPUTTYPE_UINT;
  outputTypes[6] = OUTPUTTYPE_IVEC2;
  outputTypes[7] = OUTPUTTYPE_IVEC3;
  outputTypes[0] = OUTPUTTYPE_FLOAT;
  outputTypes[1] = OUTPUTTYPE_VEC2;
  outputTypes[2] = OUTPUTTYPE_VEC3;
  outputTypes[3] = OUTPUTTYPE_VEC4;
  for (lVar9 = 0; lVar9 != 0xc; lVar9 = lVar9 + 1) {
    outputTypeWeights.weights[lVar9] = 1.0;
  }
  usages[4] = USAGE_STREAM_COPY;
  usages[5] = USAGE_STATIC_READ;
  usages[6] = USAGE_STATIC_COPY;
  usages[7] = USAGE_DYNAMIC_READ;
  usages[0] = USAGE_DYNAMIC_DRAW;
  usages[1] = USAGE_STATIC_DRAW;
  usages[2] = USAGE_STREAM_DRAW;
  usages[3] = USAGE_STREAM_READ;
  usages[8] = USAGE_DYNAMIC_COPY;
  for (lVar9 = 0; lVar9 != 9; lVar9 = lVar9 + 1) {
    usageWeights.weights[lVar9] = 1.0;
  }
  insertedHashes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &insertedHashes._M_t._M_impl.super__Rb_tree_header._M_header;
  insertedHashes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  insertedHashes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  insertedHashes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  insertedCount = 0;
  uVar11 = 0;
  indexOffsets[2] = firsts[2];
  insertedHashes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       insertedHashes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((int)uVar11 == 100) {
LAB_003e1f10:
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&insertedHashes._M_t);
      return extraout_EAX;
    }
    deRandom_init(&random.m_rnd,(int)uVar11 + 0xc551393);
    uVar2 = de::Random::chooseWeighted<int,int_const*,float_const*>
                      ((Random *)&random.m_rnd,attribCounts,&local_354,attribWeights);
    gls::DrawTestSpec::DrawTestSpec(&spec);
    spec.apiType.m_bits = 0x13;
    spec.primitive =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive*,float_const*>
                   ((Random *)&random.m_rnd,primitives,&local_20c,primitiveWeights.weights);
    spec.primitiveCount =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&random.m_rnd,primitiveCounts,&local_364,primitiveCountWeights);
    spec.drawMethod =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::DrawMethod,deqp::gls::DrawTestSpec::DrawMethod*,float_const*>
                   ((Random *)&random.m_rnd,drawMethods,(DrawMethod *)&spec,local_340);
    iVar12 = 0x10;
    if (spec.drawMethod != DRAWMETHOD_DRAWARRAYS_INDIRECT) {
      if (spec.drawMethod != DRAWMETHOD_DRAWELEMENTS_INDIRECT) {
        std::
        _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
        ::~_Vector_base(&spec.attribs.
                         super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                       );
        goto LAB_003e1f10;
      }
      iVar12 = 0x14;
    }
    spec.indexType =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::IndexType,deqp::gls::DrawTestSpec::IndexType*,float_const*>
                   ((Random *)&random.m_rnd,indexTypes,&local_3a4,indexTypeWeights.weights);
    spec.indexPointerOffset =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&random.m_rnd,indexOffsets,&local_374,indexOffsetWeights);
    spec.indexStorage = STORAGE_BUFFER;
    spec.first = de::Random::chooseWeighted<int,int_const*,float_const*>
                           ((Random *)&random.m_rnd,firsts,&local_384,firstWeights);
    spec.indexMin =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&random.m_rnd,indexMins,instanceCounts,indexWeights);
    spec.indexMax =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&random.m_rnd,indexMaxs,indexMins,indexWeights);
    spec.instanceCount =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&random.m_rnd,instanceCounts,&local_258,instanceWeights);
    iVar3 = de::Random::chooseWeighted<int,int_const*,float_const*>
                      ((Random *)&random.m_rnd,indirectOffsets,&local_394,indirectOffsetWeigths);
    spec.indirectOffset = iVar3 * iVar12;
    spec.baseVertex =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&random.m_rnd,baseVertices,local_2d4,baseVertexWeigths);
    bVar1 = gls::DrawTestSpec::valid(&spec);
    if (bVar1) {
      iVar12 = 0;
      local_348 = uVar11;
LAB_003e1bb2:
      while (uVar11 = local_348, iVar12 < (int)uVar2) {
        gls::DrawTestSpec::AttributeSpec::AttributeSpec(&attribSpec);
        attribSpec.inputType =
             de::Random::
             chooseWeighted<deqp::gls::DrawTestSpec::InputType,deqp::gls::DrawTestSpec::InputType*,float_const*>
                       ((Random *)&random.m_rnd,inputTypes,&local_11c,inputTypeWeights.weights);
        attribSpec.outputType =
             de::Random::
             chooseWeighted<deqp::gls::DrawTestSpec::OutputType,deqp::gls::DrawTestSpec::OutputType*,float_const*>
                       ((Random *)&random.m_rnd,outputTypes,local_e8,outputTypeWeights.weights);
        attribSpec.storage = STORAGE_BUFFER;
        attribSpec.usage =
             de::Random::
             chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage*,float_const*>
                       ((Random *)&random.m_rnd,usages,local_1e4,usageWeights.weights);
        dVar4 = deRandom_getUint32(&random.m_rnd);
        attribSpec.componentCount = (dVar4 & 3) + 1;
        attribSpec.offset =
             de::Random::chooseWeighted<int,int_const*,float_const*>
                       ((Random *)&random.m_rnd,offsets,(int *)indexWeights,offsetWeights);
        attribSpec.stride =
             de::Random::chooseWeighted<int,int_const*,float_const*>
                       ((Random *)&random.m_rnd,strides,offsets,strideWeights);
        attribSpec.normalize = de::Random::getBool((Random *)&random.m_rnd);
        attribSpec.instanceDivisor =
             de::Random::chooseWeighted<int,int_const*,float_const*>
                       ((Random *)&random.m_rnd,instanceDivisors,strides,instanceDivisorWeights);
        attribSpec.useDefaultAttribute = de::Random::getBool((Random *)&random.m_rnd);
        bVar1 = gls::DrawTestSpec::AttributeSpec::valid(&attribSpec,spec.apiType);
        iVar3 = attribSpec.componentCount;
        if (attribSpec.stride == 0) goto LAB_003e1d08;
        iVar5 = gls::DrawTestSpec::inputTypeSize(attribSpec.inputType);
        if (bVar1 && iVar5 * iVar3 <= attribSpec.stride) goto LAB_003e1d0d;
      }
      if (spec.primitive != PRIMITIVE_POINTS) {
        (spec.attribs.
         super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
         ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
      }
      if (((((spec.drawMethod != DRAWMETHOD_DRAWELEMENTS_RANGED) ||
            (spec.primitive == PRIMITIVE_POINTS)) || (spec.indexMin != spec.indexMax)) &&
          ((spec.primitive == PRIMITIVE_POINTS ||
           ((spec.attribs.
             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute == false)))) &&
         ((2 < spec.primitive - PRIMITIVE_TRIANGLES ||
          ((((spec.attribs.
              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ._M_impl.super__Vector_impl_data._M_start)->componentCount != 1 &&
            ((OUTPUTTYPE_UINT <
              (spec.attribs.
               super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
               ._M_impl.super__Vector_impl_data._M_start)->outputType ||
             ((0x31U >> ((spec.attribs.
                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start)->outputType & 0x1f) & 1) == 0))
            )) && ((spec.drawMethod != DRAWMETHOD_DRAWELEMENTS_RANGED ||
                   (1 < spec.indexMax - spec.indexMin)))))))) {
        uVar6 = gls::DrawTestSpec::hash(&spec);
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        for (lVar9 = 0; hash = uVar6, (ulong)uVar2 * 0x28 - lVar9 != 0; lVar9 = lVar9 + 0x28) {
          uVar7 = gls::DrawTestSpec::AttributeSpec::hash
                            ((AttributeSpec *)
                             ((long)&(spec.attribs.
                                      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->inputType + lVar9)
                            );
          uVar6 = uVar6 << 2 ^ uVar7;
        }
        iVar10 = std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(&insertedHashes._M_t,&hash);
        if ((_Rb_tree_header *)iVar10._M_node == &insertedHashes._M_t._M_impl.super__Rb_tree_header)
        {
          CVar8 = gls::DrawTestSpec::isCompatibilityTest(&spec);
          if ((CVar8 != COMPATIBILITY_UNALIGNED_OFFSET) &&
             (CVar8 = gls::DrawTestSpec::isCompatibilityTest(&spec),
             CVar8 != COMPATIBILITY_UNALIGNED_STRIDE)) {
            this_00 = (DrawTest *)operator_new(0x138);
            testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            renderCtx = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
            de::toString<unsigned_long>((string *)&attribSpec,&insertedCount);
            local_350 = (char *)CONCAT44(attribSpec.outputType,attribSpec.inputType);
            gls::DrawTestSpec::getDesc_abi_cxx11_(&local_198,&spec);
            gls::DrawTest::DrawTest
                      (this_00,testCtx,renderCtx,&spec,local_350,local_198._M_dataplus._M_p);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
            std::__cxx11::string::~string((string *)&local_198);
            std::__cxx11::string::~string((string *)&attribSpec);
          }
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&insertedHashes,&hash);
          insertedCount = insertedCount + 1;
        }
      }
    }
    std::
    _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ::~_Vector_base(&spec.attribs.
                     super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                   );
    uVar11 = (ulong)((int)uVar11 + 1);
  } while( true );
LAB_003e1d08:
  if (bVar1) {
LAB_003e1d0d:
    std::
    vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ::push_back(&spec.attribs,&attribSpec);
    iVar12 = iVar12 + 1;
  }
  goto LAB_003e1bb2;
}

Assistant:

void RandomGroup::init (void)
{
	const int	numAttempts				= 100;

	const int	attribCounts[]			= { 1,   2,   5 };
	const float	attribWeights[]			= { 30, 10,   1 };
	const int	primitiveCounts[]		= { 1,   5,  64 };
	const float	primitiveCountWeights[]	= { 20, 10,   1 };
	const int	indexOffsets[]			= { 0,   7,  13 };
	const float	indexOffsetWeights[]	= { 20, 20,   1 };
	const int	firsts[]				= { 0,   7,  13 };
	const float	firstWeights[]			= { 20, 20,   1 };

	const int	instanceCounts[]		= { 1,   2,  16,  17 };
	const float	instanceWeights[]		= { 20, 10,   5,   1 };
	const int	indexMins[]				= { 0,   1,   3,   8 };
	const int	indexMaxs[]				= { 4,   8, 128, 257 };
	const float	indexWeights[]			= { 50, 50,  50,  50 };
	const int	offsets[]				= { 0,   1,   5,  12 };
	const float	offsetWeights[]			= { 50, 10,  10,  10 };
	const int	strides[]				= { 0,   7,  16,  17 };
	const float	strideWeights[]			= { 50, 10,  10,  10 };
	const int	instanceDivisors[]		= { 0,   1,   3, 129 };
	const float	instanceDivisorWeights[]= { 70, 30,  10,  10 };

	const int	indirectOffsets[]		= { 0,   1,   2 };
	const float indirectOffsetWeigths[]	= { 2,   1,   1 };
	const int	baseVertices[]			= { 0,   1,  -2,   4,  3 };
	const float baseVertexWeigths[]		= { 4,   1,   1,   1,  1 };

	gls::DrawTestSpec::Primitive primitives[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(primitives)> primitiveWeights;

	gls::DrawTestSpec::DrawMethod drawMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INDIRECT,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INDIRECT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(drawMethods)> drawMethodWeights;

	gls::DrawTestSpec::IndexType indexTypes[] =
	{
		gls::DrawTestSpec::INDEXTYPE_BYTE,
		gls::DrawTestSpec::INDEXTYPE_SHORT,
		gls::DrawTestSpec::INDEXTYPE_INT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(indexTypes)> indexTypeWeights;

	gls::DrawTestSpec::InputType inputTypes[] =
	{
		gls::DrawTestSpec::INPUTTYPE_FLOAT,
		gls::DrawTestSpec::INPUTTYPE_FIXED,
		gls::DrawTestSpec::INPUTTYPE_BYTE,
		gls::DrawTestSpec::INPUTTYPE_SHORT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT,
		gls::DrawTestSpec::INPUTTYPE_INT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT,
		gls::DrawTestSpec::INPUTTYPE_HALF,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10,
		gls::DrawTestSpec::INPUTTYPE_INT_2_10_10_10,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(inputTypes)> inputTypeWeights;

	gls::DrawTestSpec::OutputType outputTypes[] =
	{
		gls::DrawTestSpec::OUTPUTTYPE_FLOAT,
		gls::DrawTestSpec::OUTPUTTYPE_VEC2,
		gls::DrawTestSpec::OUTPUTTYPE_VEC3,
		gls::DrawTestSpec::OUTPUTTYPE_VEC4,
		gls::DrawTestSpec::OUTPUTTYPE_INT,
		gls::DrawTestSpec::OUTPUTTYPE_UINT,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC4,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC4,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(outputTypes)> outputTypeWeights;

	gls::DrawTestSpec::Usage usages[] =
	{
		gls::DrawTestSpec::USAGE_DYNAMIC_DRAW,
		gls::DrawTestSpec::USAGE_STATIC_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_READ,
		gls::DrawTestSpec::USAGE_STREAM_COPY,
		gls::DrawTestSpec::USAGE_STATIC_READ,
		gls::DrawTestSpec::USAGE_STATIC_COPY,
		gls::DrawTestSpec::USAGE_DYNAMIC_READ,
		gls::DrawTestSpec::USAGE_DYNAMIC_COPY,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(usages)> usageWeights;

	std::set<deUint32>	insertedHashes;
	size_t				insertedCount = 0;

	for (int ndx = 0; ndx < numAttempts; ++ndx)
	{
		de::Random random(0xc551393 + ndx); // random does not depend on previous cases

		int					attributeCount = random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(attribCounts), DE_ARRAY_END(attribCounts), attribWeights);
		int					drawCommandSize;
		gls::DrawTestSpec	spec;

		spec.apiType				= glu::ApiType::es(3,1);
		spec.primitive				= random.chooseWeighted<gls::DrawTestSpec::Primitive>	(DE_ARRAY_BEGIN(primitives),		DE_ARRAY_END(primitives),		primitiveWeights.weights);
		spec.primitiveCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(primitiveCounts),	DE_ARRAY_END(primitiveCounts),	primitiveCountWeights);
		spec.drawMethod				= random.chooseWeighted<gls::DrawTestSpec::DrawMethod>	(DE_ARRAY_BEGIN(drawMethods),		DE_ARRAY_END(drawMethods),		drawMethodWeights.weights);

		if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INDIRECT)
			drawCommandSize = sizeof(deUint32[4]);
		else if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INDIRECT)
			drawCommandSize = sizeof(deUint32[5]);
		else
		{
			DE_ASSERT(DE_FALSE);
			return;
		}

		spec.indexType				= random.chooseWeighted<gls::DrawTestSpec::IndexType>	(DE_ARRAY_BEGIN(indexTypes),		DE_ARRAY_END(indexTypes),		indexTypeWeights.weights);
		spec.indexPointerOffset		= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexOffsets),		DE_ARRAY_END(indexOffsets),		indexOffsetWeights);
		spec.indexStorage			= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.first					= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(firsts),			DE_ARRAY_END(firsts),			firstWeights);
		spec.indexMin				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMins),			DE_ARRAY_END(indexMins),		indexWeights);
		spec.indexMax				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMaxs),			DE_ARRAY_END(indexMaxs),		indexWeights);
		spec.instanceCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(instanceCounts),	DE_ARRAY_END(instanceCounts),	instanceWeights);
		spec.indirectOffset			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indirectOffsets),	DE_ARRAY_END(indirectOffsets),	indirectOffsetWeigths) * drawCommandSize;
		spec.baseVertex				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(baseVertices),		DE_ARRAY_END(baseVertices),		baseVertexWeigths);

		// check spec is legal
		if (!spec.valid())
			continue;

		for (int attrNdx = 0; attrNdx < attributeCount;)
		{
			bool valid;
			gls::DrawTestSpec::AttributeSpec attribSpec;

			attribSpec.inputType			= random.chooseWeighted<gls::DrawTestSpec::InputType>	(DE_ARRAY_BEGIN(inputTypes),		DE_ARRAY_END(inputTypes),		inputTypeWeights.weights);
			attribSpec.outputType			= random.chooseWeighted<gls::DrawTestSpec::OutputType>	(DE_ARRAY_BEGIN(outputTypes),		DE_ARRAY_END(outputTypes),		outputTypeWeights.weights);
			attribSpec.storage				= gls::DrawTestSpec::STORAGE_BUFFER;
			attribSpec.usage				= random.chooseWeighted<gls::DrawTestSpec::Usage>		(DE_ARRAY_BEGIN(usages),			DE_ARRAY_END(usages),			usageWeights.weights);
			attribSpec.componentCount		= random.getInt(1, 4);
			attribSpec.offset				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(offsets), DE_ARRAY_END(offsets), offsetWeights);
			attribSpec.stride				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(strides), DE_ARRAY_END(strides), strideWeights);
			attribSpec.normalize			= random.getBool();
			attribSpec.instanceDivisor		= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(instanceDivisors), DE_ARRAY_END(instanceDivisors), instanceDivisorWeights);
			attribSpec.useDefaultAttribute	= random.getBool();

			// check spec is legal
			valid = attribSpec.valid(spec.apiType);

			// we do not want interleaved elements. (Might result in some weird floating point values)
			if (attribSpec.stride && attribSpec.componentCount * gls::DrawTestSpec::inputTypeSize(attribSpec.inputType) > attribSpec.stride)
				valid = false;

			// try again if not valid
			if (valid)
			{
				spec.attribs.push_back(attribSpec);
				++attrNdx;
			}
		}

		// Do not collapse all vertex positions to a single positions
		if (spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
			spec.attribs[0].instanceDivisor = 0;

		// Is render result meaningful?
		{
			// Only one vertex
			if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && spec.indexMin == spec.indexMax && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;
			if (spec.attribs[0].useDefaultAttribute && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;

			// Triangle only on one axis
			if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLES || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP)
			{
				if (spec.attribs[0].componentCount == 1)
					continue;
				if (spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_FLOAT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_INT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_UINT)
					continue;
				if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && (spec.indexMax - spec.indexMin) < 2)
					continue;
			}
		}

		// Add case
		{
			deUint32 hash = spec.hash();
			for (int attrNdx = 0; attrNdx < attributeCount; ++attrNdx)
				hash = (hash << 2) ^ (deUint32)spec.attribs[attrNdx].hash();

			if (insertedHashes.find(hash) == insertedHashes.end())
			{
				// Only aligned cases
				if (spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET &&
					spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
					this->addChild(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), spec, de::toString(insertedCount).c_str(), spec.getDesc().c_str()));
				insertedHashes.insert(hash);

				++insertedCount;
			}
		}
	}
}